

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

el_action_t ed_search_next_history(EditLine *el,wint_t c)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *local_58;
  wchar_t *local_50;
  wchar_t *local_40;
  wchar_t *local_38;
  wchar_t local_30;
  wchar_t local_2c;
  wchar_t found;
  wchar_t h;
  wchar_t *hp;
  wint_t c_local;
  EditLine *el_local;
  
  local_30 = L'\0';
  (el->el_chared).c_vcmd.action = L'\0';
  (el->el_chared).c_undo.len = -1;
  *(el->el_line).lastchar = L'\0';
  if ((el->el_history).eventno == L'\0') {
    el_local._7_1_ = '\x06';
  }
  else if ((el->el_history).ref == (void *)0x0) {
    el_local._7_1_ = '\x06';
  }
  else {
    if ((el->el_flags & 0x40U) == 0) {
      wVar2 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x03',0);
      if (wVar2 == L'\xffffffff') {
        local_40 = (wchar_t *)0x0;
      }
      else {
        local_40 = (el->el_history).ev.str;
      }
      local_38 = local_40;
    }
    else {
      local_38 = hist_convert(el,L'\x03',(void *)0x0);
    }
    _found = local_38;
    if (local_38 == (wchar_t *)0x0) {
      el_local._7_1_ = '\x06';
    }
    else {
      c_setpat(el);
      for (local_2c = L'\x01'; local_2c < (el->el_history).eventno && _found != (wchar_t *)0x0;
          local_2c = local_2c + L'\x01') {
        iVar1 = wcsncmp(_found,(el->el_line).buffer,
                        (long)(el->el_line).lastchar - (long)(el->el_line).buffer >> 2);
        if (((iVar1 != 0) ||
            (_found[(long)(el->el_line).lastchar - (long)(el->el_line).buffer >> 2] != L'\0')) &&
           (wVar2 = c_hmatch(el,_found), wVar2 != L'\0')) {
          local_30 = local_2c;
        }
        if ((el->el_flags & 0x40U) == 0) {
          wVar2 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x06',0);
          if (wVar2 == L'\xffffffff') {
            local_58 = (wchar_t *)0x0;
          }
          else {
            local_58 = (el->el_history).ev.str;
          }
          local_50 = local_58;
        }
        else {
          local_50 = hist_convert(el,L'\x06',(void *)0x0);
        }
        _found = local_50;
      }
      if ((local_30 == L'\0') && (wVar2 = c_hmatch(el,(el->el_history).buf), wVar2 == L'\0')) {
        el_local._7_1_ = '\x06';
      }
      else {
        (el->el_history).eventno = local_30;
        el_local._7_1_ = hist_get(el);
      }
    }
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_search_next_history(EditLine *el, wint_t c __attribute__((__unused__)))
{
	const wchar_t *hp;
	int h;
	int found = 0;

	el->el_chared.c_vcmd.action = NOP;
	el->el_chared.c_undo.len = -1;
	*el->el_line.lastchar = '\0';	/* just in case */

	if (el->el_history.eventno == 0)
		return CC_ERROR;

	if (el->el_history.ref == NULL)
		return CC_ERROR;

	hp = HIST_FIRST(el);
	if (hp == NULL)
		return CC_ERROR;

	c_setpat(el);		/* Set search pattern !! */

	for (h = 1; h < el->el_history.eventno && hp; h++) {
#ifdef SDEBUG
		(void) fprintf(el->el_errfile, "Comparing with \"%ls\"\n", hp);
#endif
		if ((wcsncmp(hp, el->el_line.buffer, (size_t)
			    (el->el_line.lastchar - el->el_line.buffer)) ||
			hp[el->el_line.lastchar - el->el_line.buffer]) &&
		    c_hmatch(el, hp))
			found = h;
		hp = HIST_NEXT(el);
	}

	if (!found) {		/* is it the current history number? */
		if (!c_hmatch(el, el->el_history.buf)) {
#ifdef SDEBUG
			(void) fprintf(el->el_errfile, "not found\n");
#endif
			return CC_ERROR;
		}
	}
	el->el_history.eventno = found;

	return hist_get(el);
}